

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

int __thiscall ncnn::Net::load_param(Net *this,DataReader *dr)

{
  long lVar1;
  int *piVar2;
  Allocator *pAVar3;
  FILE *__stream;
  Layer *pLVar4;
  uint uVar5;
  int iVar6;
  reference pvVar7;
  undefined8 uVar8;
  reference pvVar9;
  Mat *pMVar10;
  ulong uVar11;
  reference ppLVar12;
  long *in_RSI;
  long *in_RDI;
  int lr;
  int j_4;
  int j_3;
  int dims;
  Blob *blob_3;
  int j_2;
  int *psh;
  Mat shape_hints;
  int pdlr;
  char blob_name [256];
  Blob *blob_2;
  int j_1;
  Blob *blob;
  Blob *blob_1;
  int bottom_blob_index;
  char bottom_name [256];
  int j;
  Layer *layer;
  int top_count;
  int bottom_count;
  char layer_name [256];
  char layer_type [256];
  int i;
  int blob_index;
  ParamDict pd;
  int blob_count;
  int layer_count;
  int magic;
  char *in_stack_fffffffffffff468;
  Mat *in_stack_fffffffffffff470;
  FILE *in_stack_fffffffffffff480;
  undefined4 in_stack_fffffffffffff488;
  uint in_stack_fffffffffffff48c;
  int in_stack_fffffffffffff490;
  int in_stack_fffffffffffff494;
  NetPrivate *in_stack_fffffffffffff4a0;
  reference in_stack_fffffffffffff4a8;
  reference in_stack_fffffffffffff4b0;
  reference pvVar13;
  NetPrivate *in_stack_fffffffffffff4c0;
  reference in_stack_fffffffffffff4d0;
  ParamDict *in_stack_fffffffffffff4d8;
  Net *in_stack_fffffffffffff520;
  int local_9e0;
  int local_9dc;
  void *local_9d8;
  int *local_9d0;
  undefined8 local_9c8;
  undefined4 local_9c0;
  long *local_9b8;
  undefined4 local_9b0;
  int local_9ac;
  int local_9a8;
  undefined4 local_9a4;
  int local_9a0;
  ulong local_998;
  undefined1 local_990 [8];
  int *local_988;
  Allocator *local_980;
  undefined4 local_978;
  long *local_970;
  undefined4 local_968;
  int local_964;
  int local_960;
  undefined4 local_95c;
  int local_958;
  long local_950;
  NetPrivate *local_948;
  int *local_940;
  undefined8 local_938;
  undefined4 local_930;
  long *local_928;
  undefined4 local_920;
  int local_91c;
  undefined4 local_918;
  undefined4 local_914;
  undefined4 local_910;
  long local_908;
  int local_8fc;
  reference local_8f8;
  int local_8ec;
  int *local_8e8;
  Mat local_8e0;
  Mat local_898;
  int local_850;
  allocator<char> local_849;
  string local_848 [32];
  undefined1 local_828 [256];
  reference local_728;
  int local_71c;
  reference local_718;
  allocator<char> local_709;
  string local_708 [32];
  reference local_6e8;
  int local_6dc;
  undefined1 local_6d8 [256];
  int local_5d8;
  allocator<char> local_5d1;
  string local_5d0 [39];
  allocator<char> local_5a9;
  string local_5a8 [32];
  Layer *local_588;
  undefined4 local_580;
  int local_570;
  int local_56c;
  undefined1 local_568 [256];
  undefined1 local_468 [264];
  uint local_360;
  int local_35c;
  ParamDict local_358;
  int local_344;
  int local_340;
  int local_33c;
  long *local_338;
  int local_324;
  Mat *local_320;
  int local_318;
  undefined4 local_314;
  reference local_310;
  reference local_308;
  reference local_300;
  int local_2f8;
  undefined4 local_2f4;
  Mat *local_2f0;
  reference local_2e8;
  reference local_2e0;
  void **local_2d0;
  Mat *local_2c8;
  Mat *local_2c0;
  undefined8 *local_2b0;
  Mat *local_2a8;
  Mat *local_2a0;
  NetPrivate **local_290;
  Mat *local_288;
  Mat *local_280;
  Mat *local_278;
  NetPrivate **local_268;
  undefined1 *local_258;
  void **local_248;
  Mat *local_238;
  int local_218;
  undefined4 local_214;
  Mat *local_210;
  int local_1f8;
  undefined4 local_1f4;
  void **local_1f0;
  int local_1d8;
  undefined4 local_1d4;
  undefined1 *local_1d0;
  int local_1b8;
  undefined4 local_1b4;
  NetPrivate **local_1b0;
  int local_198;
  undefined4 local_194;
  Mat *local_190;
  int local_188;
  undefined4 local_184;
  Mat *local_180;
  int local_178;
  undefined4 local_174;
  Mat *local_170;
  int local_168;
  undefined4 local_164;
  Mat *local_160;
  int local_158;
  undefined4 local_154;
  reference local_150;
  int local_148;
  undefined4 local_144;
  reference local_140;
  Mat *local_138;
  Mat *local_130;
  undefined8 local_128;
  undefined4 local_11c;
  undefined8 local_118;
  undefined8 local_110;
  int local_104;
  NetPrivate **local_100;
  undefined8 local_f8;
  undefined4 local_ec;
  undefined8 local_e8;
  undefined8 local_e0;
  int local_d8;
  int local_d4;
  Net *local_d0;
  undefined8 local_c8;
  undefined4 local_bc;
  undefined8 local_b8;
  undefined8 local_b0;
  int local_a4;
  int local_a0;
  int local_9c;
  void **local_98;
  void *local_90;
  void *local_88;
  void *local_80;
  void *local_78;
  void *local_70;
  void *local_68;
  NetPrivate *local_58;
  _func_int **local_48;
  void *local_38;
  Mat *local_18;
  undefined4 local_c;
  long local_8;
  
  local_33c = 0;
  local_338 = in_RSI;
  iVar6 = (**(code **)(*in_RSI + 0x10))(in_RSI,"%d",&local_33c);
  if (iVar6 == 1) {
    if (local_33c == 0x7685dd) {
      local_340 = 0;
      local_344 = 0;
      iVar6 = (**(code **)(*local_338 + 0x10))(local_338,"%d",&local_340);
      if (iVar6 == 1) {
        iVar6 = (**(code **)(*local_338 + 0x10))(local_338,"%d",&local_344);
        if (iVar6 == 1) {
          if ((local_340 < 1) || (local_344 < 1)) {
            fprintf(_stderr,"invalid layer_count or blob_count");
            fprintf(_stderr,"\n");
            local_324 = -1;
          }
          else {
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                      ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                       CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
                       CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488));
            std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::resize
                      ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                       CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
                       CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488));
            ParamDict::ParamDict
                      ((ParamDict *)CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490));
            local_35c = 0;
            for (local_360 = 0; (int)local_360 < local_340; local_360 = local_360 + 1) {
              local_56c = 0;
              local_570 = 0;
              iVar6 = (**(code **)(*local_338 + 0x10))(local_338,"%255s",local_468);
              if (iVar6 != 1) {
                fprintf(_stderr,"parse layer_type failed");
                fprintf(_stderr,"\n");
                local_324 = -1;
                goto LAB_001a98cc;
              }
              iVar6 = (**(code **)(*local_338 + 0x10))(local_338,"%255s",local_568);
              if (iVar6 != 1) {
                fprintf(_stderr,"parse layer_name failed");
                fprintf(_stderr,"\n");
                local_324 = -1;
                goto LAB_001a98cc;
              }
              iVar6 = (**(code **)(*local_338 + 0x10))(local_338,"%d",&local_56c);
              if (iVar6 != 1) {
                fprintf(_stderr,"parse bottom_count failed");
                fprintf(_stderr,"\n");
                local_324 = -1;
                goto LAB_001a98cc;
              }
              iVar6 = (**(code **)(*local_338 + 0x10))(local_338,"%d",&local_570);
              if (iVar6 != 1) {
                fprintf(_stderr,"parse top_count failed");
                fprintf(_stderr,"\n");
                local_324 = -1;
                goto LAB_001a98cc;
              }
              local_588 = (Layer *)(**(code **)(*in_RDI + 0x20))(in_RDI,local_468);
              if (local_588 == (Layer *)0x0) {
                local_588 = create_layer(in_stack_fffffffffffff468);
              }
              if (local_588 == (Layer *)0x0) {
                local_588 = (Layer *)(**(code **)(*in_RDI + 0x18))(in_RDI,local_468);
              }
              if (local_588 == (Layer *)0x0) {
                fprintf(_stderr,"layer %s not exists or registered",local_468);
                fprintf(_stderr,"\n");
                clear(in_stack_fffffffffffff520);
                local_324 = -1;
                goto LAB_001a98cc;
              }
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff4b0,(char *)in_stack_fffffffffffff4a8,
                         (allocator<char> *)in_stack_fffffffffffff4a0);
              std::__cxx11::string::operator=((string *)&local_588->type,local_5a8);
              std::__cxx11::string::~string(local_5a8);
              std::allocator<char>::~allocator(&local_5a9);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff4b0,(char *)in_stack_fffffffffffff4a8,
                         (allocator<char> *)in_stack_fffffffffffff4a0);
              std::__cxx11::string::operator=((string *)&local_588->name,local_5d0);
              std::__cxx11::string::~string(local_5d0);
              std::allocator<char>::~allocator(&local_5d1);
              std::vector<int,_std::allocator<int>_>::resize
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
                         CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488));
              for (local_5d8 = 0; local_5d8 < local_56c; local_5d8 = local_5d8 + 1) {
                iVar6 = (**(code **)(*local_338 + 0x10))(local_338,"%255s",local_6d8);
                if (iVar6 != 1) {
                  fprintf(_stderr,"parse bottom_name failed");
                  fprintf(_stderr,"\n");
                  local_324 = -1;
                  goto LAB_001a98cc;
                }
                local_6dc = find_blob_index_by_name
                                      ((Net *)CONCAT44(in_stack_fffffffffffff48c,
                                                       in_stack_fffffffffffff488),
                                       (char *)in_stack_fffffffffffff480);
                if (local_6dc == -1) {
                  local_6e8 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                        ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                         (in_RDI[9] + 8),(long)local_35c);
                  local_6dc = local_35c;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff4b0,(char *)in_stack_fffffffffffff4a8,
                             (allocator<char> *)in_stack_fffffffffffff4a0);
                  std::__cxx11::string::operator=((string *)local_6e8,local_708);
                  std::__cxx11::string::~string(local_708);
                  std::allocator<char>::~allocator(&local_709);
                  local_35c = local_35c + 1;
                }
                local_718 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                      ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                       (in_RDI[9] + 8),(long)local_6dc);
                iVar6 = local_6dc;
                local_718->consumer = local_360;
                pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (&local_588->bottoms,(long)local_5d8);
                *pvVar7 = iVar6;
              }
              std::vector<int,_std::allocator<int>_>::resize
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
                         CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488));
              for (local_71c = 0; local_71c < local_570; local_71c = local_71c + 1) {
                local_728 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                      ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                       (in_RDI[9] + 8),(long)local_35c);
                iVar6 = (**(code **)(*local_338 + 0x10))(local_338,"%255s",local_828);
                if (iVar6 != 1) {
                  fprintf(_stderr,"parse blob_name failed");
                  fprintf(_stderr,"\n");
                  local_324 = -1;
                  goto LAB_001a98cc;
                }
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff4b0,(char *)in_stack_fffffffffffff4a8,
                           (allocator<char> *)in_stack_fffffffffffff4a0);
                std::__cxx11::string::operator=((string *)local_728,local_848);
                std::__cxx11::string::~string(local_848);
                std::allocator<char>::~allocator(&local_849);
                iVar6 = local_35c;
                local_728->producer = local_360;
                pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (&local_588->tops,(long)local_71c);
                *pvVar7 = iVar6;
                local_35c = local_35c + 1;
              }
              local_850 = ParamDict::load_param
                                    (in_stack_fffffffffffff4d8,
                                     (DataReader *)in_stack_fffffffffffff4d0);
              uVar5 = local_360;
              __stream = _stderr;
              if (local_850 == 0) {
                if ((local_588->support_int8_storage & 1U) != 0) {
                  *(undefined1 *)((long)in_RDI + 0x27) = 0;
                }
                local_320 = &local_8e0;
                local_8e0.data = (void *)0x0;
                local_8e0.refcount = (int *)0x0;
                local_8e0.elemsize = 0;
                local_8e0.elempack = 0;
                local_8e0.allocator = (Allocator *)0x0;
                local_8e0.dims = 0;
                local_8e0.w = 0;
                local_8e0.h = 0;
                local_8e0.d = 0;
                local_8e0.c = 0;
                local_8e0.cstep = 0;
                ParamDict::get(&local_898,&local_358,0x1e,&local_8e0);
                local_278 = &local_8e0;
                local_190 = local_278;
                if (local_8e0.refcount != (int *)0x0) {
                  local_194 = 0xffffffff;
                  LOCK();
                  local_198 = *local_8e0.refcount;
                  *local_8e0.refcount = *local_8e0.refcount + -1;
                  UNLOCK();
                  if (local_198 == 1) {
                    if (local_8e0.allocator == (Allocator *)0x0) {
                      local_68 = local_8e0.data;
                      if (local_8e0.data != (void *)0x0) {
                        free(local_8e0.data);
                      }
                    }
                    else {
                      (*(local_8e0.allocator)->_vptr_Allocator[3])
                                (local_8e0.allocator,local_8e0.data);
                    }
                  }
                }
                local_8e0.data = (void *)0x0;
                local_8e0.elemsize = 0;
                local_8e0.elempack = 0;
                local_8e0.dims = 0;
                local_8e0.w = 0;
                local_8e0.h = 0;
                local_8e0.d = 0;
                local_8e0.c = 0;
                local_8e0.cstep = 0;
                local_8e0.refcount = (int *)0x0;
                local_138 = &local_898;
                if ((int *)local_898.data != (int *)0x0) {
                  local_18 = local_138;
                }
                if ((int *)local_898.data != (int *)0x0 && local_898.cstep * (long)local_898.c != 0)
                {
                  local_130 = &local_898;
                  local_8e8 = (int *)local_898.data;
                  for (local_8ec = 0; local_8ec < local_570; local_8ec = local_8ec + 1) {
                    lVar1 = in_RDI[9];
                    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                       (&local_588->tops,(long)local_8ec);
                    pvVar9 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                       ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                        (lVar1 + 8),(long)*pvVar7);
                    local_8fc = *local_8e8;
                    local_8f8 = pvVar9;
                    if (local_8fc == 1) {
                      local_104 = local_8e8[1];
                      local_100 = &local_948;
                      local_110 = 0;
                      local_118 = 4;
                      local_11c = 1;
                      local_128 = 0;
                      local_948 = (NetPrivate *)0x0;
                      local_940 = (int *)0x0;
                      local_938 = 4;
                      local_930 = 1;
                      local_928 = (long *)0x0;
                      local_920 = 1;
                      local_91c = local_104;
                      local_918 = 1;
                      local_914 = 1;
                      local_910 = 1;
                      local_908 = (long)local_104;
                      pMVar10 = &pvVar9->shape;
                      local_290 = &local_948;
                      local_288 = pMVar10;
                      if (pMVar10 != (Mat *)local_290) {
                        local_180 = pMVar10;
                        if ((pvVar9->shape).refcount != (int *)0x0) {
                          piVar2 = (pvVar9->shape).refcount;
                          local_184 = 0xffffffff;
                          LOCK();
                          local_188 = *piVar2;
                          *piVar2 = *piVar2 + -1;
                          UNLOCK();
                          if (local_188 == 1) {
                            if ((pvVar9->shape).allocator == (Allocator *)0x0) {
                              local_70 = pMVar10->data;
                              if (local_70 != (void *)0x0) {
                                free(local_70);
                              }
                            }
                            else {
                              pAVar3 = (pvVar9->shape).allocator;
                              (*pAVar3->_vptr_Allocator[3])(pAVar3,pMVar10->data);
                            }
                          }
                        }
                        pMVar10->data = (void *)0x0;
                        (pvVar9->shape).elemsize = 0;
                        (pvVar9->shape).elempack = 0;
                        (pvVar9->shape).dims = 0;
                        (pvVar9->shape).w = 0;
                        (pvVar9->shape).h = 0;
                        (pvVar9->shape).d = 0;
                        (pvVar9->shape).c = 0;
                        (pvVar9->shape).cstep = 0;
                        (pvVar9->shape).refcount = (int *)0x0;
                        pMVar10->data = *local_290;
                        (pvVar9->shape).refcount = (int *)local_290[1];
                        (pvVar9->shape).elemsize = (size_t)local_290[2];
                        (pvVar9->shape).elempack = *(int *)(local_290 + 3);
                        (pvVar9->shape).allocator = (Allocator *)local_290[4];
                        (pvVar9->shape).dims = *(int *)(local_290 + 5);
                        (pvVar9->shape).w = *(int *)((long)local_290 + 0x2c);
                        (pvVar9->shape).h = *(int *)(local_290 + 6);
                        (pvVar9->shape).d = *(int *)((long)local_290 + 0x34);
                        (pvVar9->shape).c = *(int *)(local_290 + 7);
                        (pvVar9->shape).cstep = (size_t)local_290[8];
                      }
                      local_268 = &local_948;
                      local_280 = pMVar10;
                      local_1b0 = local_268;
                      if (local_940 != (int *)0x0) {
                        local_1b4 = 0xffffffff;
                        LOCK();
                        local_1b8 = *local_940;
                        *local_940 = *local_940 + -1;
                        UNLOCK();
                        if (local_1b8 == 1) {
                          if (local_928 == (long *)0x0) {
                            local_58 = local_948;
                            if (local_948 != (NetPrivate *)0x0) {
                              free(local_948);
                            }
                          }
                          else {
                            (**(code **)(*local_928 + 0x18))(local_928,local_948);
                          }
                        }
                      }
                      local_948 = (NetPrivate *)0x0;
                      local_938 = 0;
                      local_930 = 0;
                      local_920 = 0;
                      local_91c = 0;
                      local_918 = 0;
                      local_914 = 0;
                      local_910 = 0;
                      local_908 = 0;
                      local_940 = (int *)0x0;
                    }
                    pvVar9 = local_8f8;
                    if (local_8fc == 2) {
                      local_d4 = local_8e8[1];
                      local_d8 = local_8e8[2];
                      in_stack_fffffffffffff520 = (Net *)local_990;
                      local_e0 = 0;
                      local_e8 = 4;
                      local_ec = 1;
                      local_f8 = 0;
                      local_990 = (undefined1  [8])0x0;
                      local_988 = (int *)0x0;
                      local_980 = (Allocator *)0x4;
                      local_978 = 1;
                      local_970 = (long *)0x0;
                      local_968._0_1_ = true;
                      local_968._1_1_ = false;
                      local_968._2_1_ = false;
                      local_968._3_1_ = false;
                      local_964 = local_d4;
                      local_960 = local_d8;
                      local_95c._0_1_ = true;
                      local_95c._1_1_ = false;
                      local_95c._2_1_ = false;
                      local_95c._3_1_ = false;
                      local_958 = 1;
                      local_950 = (long)local_d4 * (long)local_d8;
                      pMVar10 = &local_8f8->shape;
                      local_2b0 = (undefined8 *)local_990;
                      local_2a8 = pMVar10;
                      local_d0 = in_stack_fffffffffffff520;
                      if (pMVar10 != (Mat *)local_2b0) {
                        local_170 = pMVar10;
                        if ((local_8f8->shape).refcount != (int *)0x0) {
                          piVar2 = (local_8f8->shape).refcount;
                          local_174 = 0xffffffff;
                          LOCK();
                          local_178 = *piVar2;
                          *piVar2 = *piVar2 + -1;
                          UNLOCK();
                          if (local_178 == 1) {
                            if ((local_8f8->shape).allocator == (Allocator *)0x0) {
                              local_78 = pMVar10->data;
                              if (local_78 != (void *)0x0) {
                                free(local_78);
                              }
                            }
                            else {
                              pAVar3 = (local_8f8->shape).allocator;
                              (*pAVar3->_vptr_Allocator[3])(pAVar3,pMVar10->data);
                            }
                          }
                        }
                        pMVar10->data = (void *)0x0;
                        (pvVar9->shape).elemsize = 0;
                        (pvVar9->shape).elempack = 0;
                        (pvVar9->shape).dims = 0;
                        (pvVar9->shape).w = 0;
                        (pvVar9->shape).h = 0;
                        (pvVar9->shape).d = 0;
                        (pvVar9->shape).c = 0;
                        (pvVar9->shape).cstep = 0;
                        (pvVar9->shape).refcount = (int *)0x0;
                        pMVar10->data = (void *)*local_2b0;
                        (pvVar9->shape).refcount = (int *)local_2b0[1];
                        (pvVar9->shape).elemsize = local_2b0[2];
                        (pvVar9->shape).elempack = *(int *)(local_2b0 + 3);
                        (pvVar9->shape).allocator = (Allocator *)local_2b0[4];
                        (pvVar9->shape).dims = *(int *)(local_2b0 + 5);
                        (pvVar9->shape).w = *(int *)((long)local_2b0 + 0x2c);
                        (pvVar9->shape).h = *(int *)(local_2b0 + 6);
                        (pvVar9->shape).d = *(int *)((long)local_2b0 + 0x34);
                        (pvVar9->shape).c = *(int *)(local_2b0 + 7);
                        (pvVar9->shape).cstep = local_2b0[8];
                      }
                      local_258 = local_990;
                      local_2a0 = pMVar10;
                      local_1d0 = local_258;
                      if (local_988 != (int *)0x0) {
                        local_1d4 = 0xffffffff;
                        LOCK();
                        local_1d8 = *local_988;
                        *local_988 = *local_988 + -1;
                        UNLOCK();
                        if (local_1d8 == 1) {
                          if (local_970 == (long *)0x0) {
                            local_48 = (_func_int **)local_990;
                            if (local_990 != (undefined1  [8])0x0) {
                              free((void *)local_990);
                            }
                          }
                          else {
                            (**(code **)(*local_970 + 0x18))(local_970,local_990);
                          }
                        }
                      }
                      local_990 = (undefined1  [8])0x0;
                      local_980 = (Allocator *)0x0;
                      local_978 = 0;
                      local_968._0_1_ = false;
                      local_968._1_1_ = false;
                      local_968._2_1_ = false;
                      local_968._3_1_ = false;
                      local_964._0_1_ = false;
                      local_964._1_1_ = false;
                      local_964._2_1_ = false;
                      local_964._3_1_ = false;
                      local_960._0_1_ = false;
                      local_960._1_1_ = false;
                      local_960._2_1_ = false;
                      local_960._3_1_ = false;
                      local_95c._0_1_ = false;
                      local_95c._1_1_ = false;
                      local_95c._2_1_ = false;
                      local_95c._3_1_ = false;
                      local_958 = 0;
                      local_950._0_1_ = false;
                      local_950._1_1_ = false;
                      local_950._2_1_ = false;
                      local_950._3_1_ = false;
                      local_950._4_1_ = false;
                      local_950._5_1_ = false;
                      local_950._6_1_ = false;
                      local_950._7_1_ = false;
                      local_988 = (int *)0x0;
                    }
                    pvVar9 = local_8f8;
                    if (local_8fc == 3) {
                      local_9c = local_8e8[1];
                      local_a0 = local_8e8[2];
                      local_a4 = local_8e8[3];
                      local_98 = &local_9d8;
                      local_b0 = 0;
                      local_b8 = 4;
                      local_bc = 1;
                      local_c8 = 0;
                      local_9d8 = (void *)0x0;
                      local_9d0 = (int *)0x0;
                      local_9c8 = 4;
                      local_9c0 = 1;
                      local_9b8 = (long *)0x0;
                      local_9b0 = 3;
                      local_9ac = local_9c;
                      local_9a8 = local_a0;
                      local_9a4 = 1;
                      local_9a0 = local_a4;
                      local_8 = (long)local_9c * (long)local_a0 * 4;
                      local_c = 0x10;
                      uVar11 = local_8 + 0xfU & 0xfffffffffffffff0;
                      local_998 = uVar11 / 4;
                      pMVar10 = &local_8f8->shape;
                      local_2d0 = &local_9d8;
                      local_2c8 = pMVar10;
                      if (pMVar10 != (Mat *)local_2d0) {
                        local_160 = pMVar10;
                        if ((local_8f8->shape).refcount != (int *)0x0) {
                          piVar2 = (local_8f8->shape).refcount;
                          local_164 = 0xffffffff;
                          LOCK();
                          local_168 = *piVar2;
                          *piVar2 = *piVar2 + -1;
                          UNLOCK();
                          if (local_168 == 1) {
                            if ((local_8f8->shape).allocator == (Allocator *)0x0) {
                              local_80 = pMVar10->data;
                              if (local_80 != (void *)0x0) {
                                free(local_80);
                              }
                            }
                            else {
                              pAVar3 = (local_8f8->shape).allocator;
                              (*pAVar3->_vptr_Allocator[3])(pAVar3,pMVar10->data,uVar11 % 4);
                            }
                          }
                        }
                        pMVar10->data = (void *)0x0;
                        (pvVar9->shape).elemsize = 0;
                        (pvVar9->shape).elempack = 0;
                        (pvVar9->shape).dims = 0;
                        (pvVar9->shape).w = 0;
                        (pvVar9->shape).h = 0;
                        (pvVar9->shape).d = 0;
                        (pvVar9->shape).c = 0;
                        (pvVar9->shape).cstep = 0;
                        (pvVar9->shape).refcount = (int *)0x0;
                        pMVar10->data = *local_2d0;
                        (pvVar9->shape).refcount = (int *)local_2d0[1];
                        (pvVar9->shape).elemsize = (size_t)local_2d0[2];
                        (pvVar9->shape).elempack = *(int *)(local_2d0 + 3);
                        (pvVar9->shape).allocator = (Allocator *)local_2d0[4];
                        (pvVar9->shape).dims = *(int *)(local_2d0 + 5);
                        (pvVar9->shape).w = *(int *)((long)local_2d0 + 0x2c);
                        (pvVar9->shape).h = *(int *)(local_2d0 + 6);
                        (pvVar9->shape).d = *(int *)((long)local_2d0 + 0x34);
                        (pvVar9->shape).c = *(int *)(local_2d0 + 7);
                        (pvVar9->shape).cstep = (size_t)local_2d0[8];
                      }
                      local_248 = &local_9d8;
                      local_2c0 = pMVar10;
                      local_1f0 = local_248;
                      if (local_9d0 != (int *)0x0) {
                        local_1f4 = 0xffffffff;
                        LOCK();
                        local_1f8 = *local_9d0;
                        *local_9d0 = *local_9d0 + -1;
                        UNLOCK();
                        if (local_1f8 == 1) {
                          if (local_9b8 == (long *)0x0) {
                            local_38 = local_9d8;
                            if (local_9d8 != (void *)0x0) {
                              free(local_9d8);
                            }
                          }
                          else {
                            (**(code **)(*local_9b8 + 0x18))(local_9b8,local_9d8);
                          }
                        }
                      }
                      local_9d8 = (void *)0x0;
                      local_9c8 = 0;
                      local_9c0 = 0;
                      local_9b0 = 0;
                      local_9ac = 0;
                      local_9a8 = 0;
                      local_9a4 = 0;
                      local_9a0 = 0;
                      local_998 = 0;
                      local_9d0 = (int *)0x0;
                    }
                    local_8e8 = local_8e8 + 4;
                  }
                }
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                          ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                           CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
                           CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488));
                for (local_9dc = 0; local_9dc < local_56c; local_9dc = local_9dc + 1) {
                  in_stack_fffffffffffff4c0 = (NetPrivate *)(in_RDI[9] + 8);
                  pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                     (&local_588->bottoms,(long)local_9dc);
                  pvVar9 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                     ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                      in_stack_fffffffffffff4c0,(long)*pvVar7);
                  pMVar10 = &pvVar9->shape;
                  in_stack_fffffffffffff4d0 =
                       std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                 (&local_588->bottom_shapes,(long)local_9dc);
                  local_2f0 = pMVar10;
                  local_2e8 = in_stack_fffffffffffff4d0;
                  if (in_stack_fffffffffffff4d0 != pMVar10) {
                    if ((pvVar9->shape).refcount != (int *)0x0) {
                      piVar2 = (pvVar9->shape).refcount;
                      local_2f4 = 1;
                      LOCK();
                      local_2f8 = *piVar2;
                      *piVar2 = *piVar2 + 1;
                      UNLOCK();
                    }
                    pvVar13 = in_stack_fffffffffffff4d0;
                    local_150 = in_stack_fffffffffffff4d0;
                    if (in_stack_fffffffffffff4d0->refcount != (int *)0x0) {
                      piVar2 = in_stack_fffffffffffff4d0->refcount;
                      local_154 = 0xffffffff;
                      LOCK();
                      local_158 = *piVar2;
                      *piVar2 = *piVar2 + -1;
                      UNLOCK();
                      if (local_158 == 1) {
                        if (in_stack_fffffffffffff4d0->allocator == (Allocator *)0x0) {
                          local_88 = in_stack_fffffffffffff4d0->data;
                          if (local_88 != (void *)0x0) {
                            free(local_88);
                          }
                        }
                        else {
                          (*in_stack_fffffffffffff4d0->allocator->_vptr_Allocator[3])
                                    (in_stack_fffffffffffff4d0->allocator,
                                     in_stack_fffffffffffff4d0->data);
                        }
                      }
                    }
                    in_stack_fffffffffffff4d0->data = (void *)0x0;
                    in_stack_fffffffffffff4d0->elemsize = 0;
                    in_stack_fffffffffffff4d0->elempack = 0;
                    in_stack_fffffffffffff4d0->dims = 0;
                    in_stack_fffffffffffff4d0->w = 0;
                    in_stack_fffffffffffff4d0->h = 0;
                    in_stack_fffffffffffff4d0->d = 0;
                    in_stack_fffffffffffff4d0->c = 0;
                    in_stack_fffffffffffff4d0->cstep = 0;
                    in_stack_fffffffffffff4d0->refcount = (int *)0x0;
                    pvVar13->data = local_2f0->data;
                    pvVar13->refcount = local_2f0->refcount;
                    pvVar13->elemsize = local_2f0->elemsize;
                    pvVar13->elempack = local_2f0->elempack;
                    pvVar13->allocator = local_2f0->allocator;
                    pvVar13->dims = local_2f0->dims;
                    pvVar13->w = local_2f0->w;
                    pvVar13->h = local_2f0->h;
                    pvVar13->d = local_2f0->d;
                    pvVar13->c = local_2f0->c;
                    pvVar13->cstep = local_2f0->cstep;
                    in_stack_fffffffffffff4d0 = pvVar13;
                  }
                  local_2e0 = in_stack_fffffffffffff4d0;
                }
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                          ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                           CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
                           CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488));
                for (local_9e0 = 0; local_9e0 < local_570; local_9e0 = local_9e0 + 1) {
                  in_stack_fffffffffffff4a0 = (NetPrivate *)(in_RDI[9] + 8);
                  pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                     (&local_588->tops,(long)local_9e0);
                  pvVar9 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                     ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                      in_stack_fffffffffffff4a0,(long)*pvVar7);
                  in_stack_fffffffffffff4a8 = &pvVar9->shape;
                  in_stack_fffffffffffff4b0 =
                       std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                 (&local_588->top_shapes,(long)local_9e0);
                  local_310 = in_stack_fffffffffffff4a8;
                  local_308 = in_stack_fffffffffffff4b0;
                  if (in_stack_fffffffffffff4b0 != in_stack_fffffffffffff4a8) {
                    if (in_stack_fffffffffffff4a8->refcount != (int *)0x0) {
                      piVar2 = in_stack_fffffffffffff4a8->refcount;
                      local_314 = 1;
                      LOCK();
                      local_318 = *piVar2;
                      *piVar2 = *piVar2 + 1;
                      UNLOCK();
                    }
                    pvVar13 = in_stack_fffffffffffff4b0;
                    local_140 = in_stack_fffffffffffff4b0;
                    if (in_stack_fffffffffffff4b0->refcount != (int *)0x0) {
                      piVar2 = in_stack_fffffffffffff4b0->refcount;
                      local_144 = 0xffffffff;
                      LOCK();
                      local_148 = *piVar2;
                      *piVar2 = *piVar2 + -1;
                      UNLOCK();
                      if (local_148 == 1) {
                        if (in_stack_fffffffffffff4b0->allocator == (Allocator *)0x0) {
                          local_90 = in_stack_fffffffffffff4b0->data;
                          if (local_90 != (void *)0x0) {
                            free(local_90);
                          }
                        }
                        else {
                          (*in_stack_fffffffffffff4b0->allocator->_vptr_Allocator[3])
                                    (in_stack_fffffffffffff4b0->allocator,
                                     in_stack_fffffffffffff4b0->data);
                        }
                      }
                    }
                    in_stack_fffffffffffff4b0->data = (void *)0x0;
                    in_stack_fffffffffffff4b0->elemsize = 0;
                    in_stack_fffffffffffff4b0->elempack = 0;
                    in_stack_fffffffffffff4b0->dims = 0;
                    in_stack_fffffffffffff4b0->w = 0;
                    in_stack_fffffffffffff4b0->h = 0;
                    in_stack_fffffffffffff4b0->d = 0;
                    in_stack_fffffffffffff4b0->c = 0;
                    in_stack_fffffffffffff4b0->cstep = 0;
                    in_stack_fffffffffffff4b0->refcount = (int *)0x0;
                    pvVar13->data = local_310->data;
                    pvVar13->refcount = local_310->refcount;
                    pvVar13->elemsize = local_310->elemsize;
                    pvVar13->elempack = local_310->elempack;
                    pvVar13->allocator = local_310->allocator;
                    pvVar13->dims = local_310->dims;
                    pvVar13->w = local_310->w;
                    pvVar13->h = local_310->h;
                    pvVar13->d = local_310->d;
                    pvVar13->c = local_310->c;
                    pvVar13->cstep = local_310->cstep;
                    in_stack_fffffffffffff4b0 = pvVar13;
                  }
                  local_300 = in_stack_fffffffffffff4b0;
                }
                in_stack_fffffffffffff494 = ParamDict::get(&local_358,0x1f,0);
                local_588->featmask = in_stack_fffffffffffff494;
                in_stack_fffffffffffff490 = (*local_588->_vptr_Layer[2])(local_588,&local_358);
                pLVar4 = local_588;
                if (in_stack_fffffffffffff490 == 0) {
                  ppLVar12 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                       ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                                        (in_RDI[9] + 0x20),(long)(int)local_360);
                  *ppLVar12 = pLVar4;
                  local_580 = 0;
                }
                else {
                  in_stack_fffffffffffff480 = _stderr;
                  in_stack_fffffffffffff48c = local_360;
                  uVar8 = std::__cxx11::string::c_str();
                  fprintf(in_stack_fffffffffffff480,"layer load_param %d %s failed",
                          (ulong)in_stack_fffffffffffff48c,uVar8);
                  fprintf(_stderr,"\n");
                  local_580 = 0xe;
                }
                in_stack_fffffffffffff470 = &local_898;
                local_238 = in_stack_fffffffffffff470;
                local_210 = in_stack_fffffffffffff470;
                if (local_898.refcount != (int *)0x0) {
                  local_214 = 0xffffffff;
                  LOCK();
                  local_218 = *local_898.refcount;
                  *local_898.refcount = *local_898.refcount + -1;
                  UNLOCK();
                  if (local_218 == 1) {
                    if (local_898.allocator == (Allocator *)0x0) {
                      if ((int *)local_898.data != (int *)0x0) {
                        free(local_898.data);
                      }
                    }
                    else {
                      (*(local_898.allocator)->_vptr_Allocator[3])
                                (local_898.allocator,local_898.data);
                    }
                  }
                }
                in_stack_fffffffffffff470->data = (void *)0x0;
                in_stack_fffffffffffff470->elemsize = 0;
                in_stack_fffffffffffff470->elempack = 0;
                in_stack_fffffffffffff470->dims = 0;
                in_stack_fffffffffffff470->w = 0;
                in_stack_fffffffffffff470->h = 0;
                in_stack_fffffffffffff470->d = 0;
                in_stack_fffffffffffff470->c = 0;
                in_stack_fffffffffffff470->cstep = 0;
                in_stack_fffffffffffff470->refcount = (int *)0x0;
              }
              else {
                uVar8 = std::__cxx11::string::c_str();
                fprintf(__stream,"ParamDict load_param %d %s failed",(ulong)uVar5,uVar8);
                fprintf(_stderr,"\n");
              }
            }
            NetPrivate::update_input_output_indexes(in_stack_fffffffffffff4a0);
            NetPrivate::update_input_output_names(in_stack_fffffffffffff4c0);
            local_324 = 0;
LAB_001a98cc:
            local_580 = 1;
            ParamDict::~ParamDict((ParamDict *)in_stack_fffffffffffff470);
          }
        }
        else {
          fprintf(_stderr,"parse blob_count failed");
          fprintf(_stderr,"\n");
          local_324 = -1;
        }
      }
      else {
        fprintf(_stderr,"parse layer_count failed");
        fprintf(_stderr,"\n");
        local_324 = -1;
      }
    }
    else {
      fprintf(_stderr,"param is too old, please regenerate");
      fprintf(_stderr,"\n");
      local_324 = -1;
    }
  }
  else {
    fprintf(_stderr,"parse magic failed");
    fprintf(_stderr,"\n");
    local_324 = -1;
  }
  return local_324;
}

Assistant:

int Net::load_param(const DataReader& dr)
{
#define SCAN_VALUE(fmt, v)                \
    if (dr.scan(fmt, &v) != 1)            \
    {                                     \
        NCNN_LOGE("parse " #v " failed"); \
        return -1;                        \
    }

    int magic = 0;
    SCAN_VALUE("%d", magic)
    if (magic != 7767517)
    {
        NCNN_LOGE("param is too old, please regenerate");
        return -1;
    }

    // parse
    int layer_count = 0;
    int blob_count = 0;
    SCAN_VALUE("%d", layer_count)
    SCAN_VALUE("%d", blob_count)
    if (layer_count <= 0 || blob_count <= 0)
    {
        NCNN_LOGE("invalid layer_count or blob_count");
        return -1;
    }

    d->layers.resize((size_t)layer_count);
    d->blobs.resize((size_t)blob_count);

#if NCNN_VULKAN
    // TODO enable gpu when bf16 conversion implemented
    if (opt.use_bf16_storage)
        opt.use_vulkan_compute = false;

    if (opt.use_vulkan_compute)
    {
        if (!d->vkdev) d->vkdev = get_gpu_device();
        if (!d->vkdev) opt.use_vulkan_compute = false; // no vulkan device, fallback to cpu
    }
    if (opt.use_vulkan_compute)
    {
        // sanitize use options
        if (!d->vkdev->info.support_fp16_packed()) opt.use_fp16_packed = false;
        if (!d->vkdev->info.support_fp16_storage()) opt.use_fp16_storage = false;
        if (!d->vkdev->info.support_fp16_arithmetic()) opt.use_fp16_arithmetic = false;
        if (!d->vkdev->info.support_int8_storage()) opt.use_int8_storage = false;
        if (!d->vkdev->info.support_int8_arithmetic()) opt.use_int8_arithmetic = false;
        if (!d->vkdev->info.support_cooperative_matrix()) opt.use_cooperative_matrix = false;

        if (d->vkdev->info.bug_buffer_image_load_zero()) opt.use_image_storage = false;

        // enable local memory optimization on discrete gpu only
        if (d->vkdev->info.type() != 0) opt.use_shader_local_memory = false;

        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_packed && !opt.use_fp16_storage) opt.use_fp16_arithmetic = false;
    }
    else
    {
        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_storage) opt.use_fp16_arithmetic = false;
    }
#endif // NCNN_VULKAN

    ParamDict pd;

    int blob_index = 0;
    for (int i = 0; i < layer_count; i++)
    {
        char layer_type[256];
        char layer_name[256];
        int bottom_count = 0;
        int top_count = 0;
        SCAN_VALUE("%255s", layer_type)
        SCAN_VALUE("%255s", layer_name)
        SCAN_VALUE("%d", bottom_count)
        SCAN_VALUE("%d", top_count)

        Layer* layer = create_overwrite_builtin_layer(layer_type);
        if (!layer)
        {
            layer = create_layer(layer_type);
        }
        if (!layer)
        {
            layer = create_custom_layer(layer_type);
        }
        if (!layer)
        {
            NCNN_LOGE("layer %s not exists or registered", layer_type);
            clear();
            return -1;
        }

#if NCNN_VULKAN
        if (opt.use_vulkan_compute)
            layer->vkdev = d->vkdev;
#endif // NCNN_VULKAN

        layer->type = std::string(layer_type);
        layer->name = std::string(layer_name);
        //         NCNN_LOGE("new layer %d %s", i, layer_name);

        layer->bottoms.resize(bottom_count);

        for (int j = 0; j < bottom_count; j++)
        {
            char bottom_name[256];
            SCAN_VALUE("%255s", bottom_name)

            int bottom_blob_index = find_blob_index_by_name(bottom_name);
            if (bottom_blob_index == -1)
            {
                Blob& blob = d->blobs[blob_index];

                bottom_blob_index = blob_index;

                blob.name = std::string(bottom_name);
                //                 NCNN_LOGE("new blob %s", bottom_name);

                blob_index++;
            }

            Blob& blob = d->blobs[bottom_blob_index];

            blob.consumer = i;

            layer->bottoms[j] = bottom_blob_index;
        }

        layer->tops.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            Blob& blob = d->blobs[blob_index];

            char blob_name[256];
            SCAN_VALUE("%255s", blob_name)

            blob.name = std::string(blob_name);
            //             NCNN_LOGE("new blob %s", blob_name);

            blob.producer = i;

            layer->tops[j] = blob_index;

            blob_index++;
        }

        // layer specific params
        int pdlr = pd.load_param(dr);
        if (pdlr != 0)
        {
            NCNN_LOGE("ParamDict load_param %d %s failed", i, layer->name.c_str());
            continue;
        }

        if (layer->support_int8_storage)
        {
            // no int8 gpu support yet
            opt.use_vulkan_compute = false;
        }

        // pull out top shape hints
        Mat shape_hints = pd.get(30, Mat());
        if (!shape_hints.empty())
        {
            const int* psh = shape_hints;
            for (int j = 0; j < top_count; j++)
            {
                Blob& blob = d->blobs[layer->tops[j]];

                int dims = psh[0];
                if (dims == 1)
                {
                    blob.shape = Mat(psh[1], (void*)0, 4u, 1);
                }
                if (dims == 2)
                {
                    blob.shape = Mat(psh[1], psh[2], (void*)0, 4u, 1);
                }
                if (dims == 3)
                {
                    blob.shape = Mat(psh[1], psh[2], psh[3], (void*)0, 4u, 1);
                }

                psh += 4;
            }
        }

        // set bottom and top shape hints
        layer->bottom_shapes.resize(bottom_count);
        for (int j = 0; j < bottom_count; j++)
        {
            layer->bottom_shapes[j] = d->blobs[layer->bottoms[j]].shape;
        }

        layer->top_shapes.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            layer->top_shapes[j] = d->blobs[layer->tops[j]].shape;
        }

        // pull out layer specific feature disabled set
        layer->featmask = pd.get(31, 0);

        int lr = layer->load_param(pd);
        if (lr != 0)
        {
            NCNN_LOGE("layer load_param %d %s failed", i, layer->name.c_str());
            continue;
        }

        d->layers[i] = layer;
    }

    d->update_input_output_indexes();
    d->update_input_output_names();

#undef SCAN_VALUE
    return 0;
}